

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_ForceField(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  FName local_1c;
  DAngle local_18;
  DAngle local_10;
  
  if (it != (AActor *)0x0) {
    local_1c.Index = 0;
    local_10.Degrees = 0.0;
    P_DamageMobj(it,(AActor *)0x0,(AActor *)0x0,0x10,&local_1c,0,&local_10);
    local_18.Degrees = (it->Angles).Yaw.Degrees + 180.0;
    AActor::Thrust(it,&local_18,7.8125);
  }
  return 1;
}

Assistant:

FUNC(LS_ForceField)
// ForceField ()
{
	if (it != NULL)
	{
		P_DamageMobj (it, NULL, NULL, 16, NAME_None);
		it->Thrust(it->Angles.Yaw + 180, 7.8125);
	}
	return true;
}